

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

bool __thiscall
chaiscript::detail::Dispatch_Engine::is_type
          (Dispatch_Engine *this,Boxed_Value *r,string_view user_typename)

{
  bool bVar1;
  bool bVar2;
  Dynamic_Object *pDVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  Type_Info TStack_38;
  
  get_type(&TStack_38,this,user_typename,true);
  bVar1 = Type_Info::bare_equal
                    (&TStack_38,
                     &((r->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info);
  bVar2 = true;
  if (!bVar1) {
    pDVar3 = boxed_cast<chaiscript::dispatch::Dynamic_Object_const&>(this,r);
    __y._M_str = (pDVar3->m_type_name)._M_dataplus._M_p;
    __y._M_len = (pDVar3->m_type_name)._M_string_length;
    bVar2 = std::operator==(user_typename,__y);
  }
  return bVar2;
}

Assistant:

bool is_type(const Boxed_Value &r, std::string_view user_typename) const noexcept {
        try {
          if (get_type(user_typename).bare_equal(r.get_type_info())) {
            return true;
          }
        } catch (const std::range_error &) {
        }

        try {
          const dispatch::Dynamic_Object &d = boxed_cast<const dispatch::Dynamic_Object &>(r);
          return d.get_type_name() == user_typename;
        } catch (const std::bad_cast &) {
        }

        return false;
      }